

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.cpp
# Opt level: O1

BSTNode * __thiscall search::BSTNode::forerunner(BSTNode *this)

{
  BSTNode *pBVar1;
  BSTNode *pBVar2;
  bool bVar3;
  
  pBVar1 = this->left_;
  if (this->left_ == (BSTNode *)0x0) {
    do {
      pBVar2 = this->parent_;
      if (pBVar2 == (BSTNode *)0x0) {
        return (BSTNode *)0x0;
      }
      bVar3 = pBVar2->left_ == this;
      this = pBVar2;
    } while (bVar3);
  }
  else {
    do {
      pBVar2 = pBVar1;
      pBVar1 = pBVar2->right_;
    } while (pBVar2->right_ != (BSTNode *)0x0);
  }
  return pBVar2;
}

Assistant:

BSTNode* BSTNode::forerunner()
    {
        if (left_)
            return left_->max();
        else
        {
            BSTNode* node = this;
            BSTNode* p = parent_;
            while (p && p->left_ == node)
            {
                // this is min of node
                node = p;
                p = node->parent_;
            }
            return p;
        }
    }